

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_iterator_reuse_retry_count(int retry_count)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  _Bool _Var3;
  roaring_bitmap_t *prVar4;
  roaring_bitmap_t *r;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  uint32_t *ref_values;
  uint32_t ref_count;
  roaring_uint32_iterator_t iterator;
  roaring_bitmap_t *bitmaps [2];
  uint32_t *local_88;
  roaring_bitmap_t *local_80;
  uint local_74;
  roaring_uint32_iterator_t local_70;
  roaring_bitmap_t *local_48 [3];
  
  test_iterator_generate_data(&local_88,&local_74);
  prVar4 = roaring_bitmap_create_with_capacity(0);
  r = roaring_bitmap_create_with_capacity(0);
  puVar1 = local_88;
  if ((ulong)local_74 != 0) {
    uVar10 = 0;
    do {
      roaring_bitmap_add(prVar4,puVar1[uVar10]);
      if ((uVar10 != 0) && (local_74 - 1 != uVar10)) {
        roaring_bitmap_add(r,puVar1[uVar10]);
      }
      uVar10 = uVar10 + 1;
    } while (local_74 != uVar10);
  }
  _Var3 = roaring_bitmap_contains(prVar4,0);
  _assert_true((ulong)_Var3,"roaring_bitmap_contains(with_edges, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff7);
  _Var3 = roaring_bitmap_contains(prVar4,0xffffffff);
  _assert_true((ulong)_Var3,"roaring_bitmap_contains(with_edges, UINT32_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff8);
  _Var3 = roaring_bitmap_contains(r,0);
  _assert_true((ulong)!_Var3,"!roaring_bitmap_contains(without_edges, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff9);
  _Var3 = roaring_bitmap_contains(r,0xffffffff);
  _assert_true((ulong)!_Var3,"!roaring_bitmap_contains(without_edges, UINT32_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xffa);
  uVar5 = roaring_bitmap_get_cardinality(prVar4);
  uVar6 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar5 - 2 == uVar6),
               "roaring_bitmap_get_cardinality(with_edges) - 2 == roaring_bitmap_get_cardinality(without_edges)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xffc);
  local_48[0] = prVar4;
  local_48[1] = r;
  lVar7 = 0;
  local_80 = prVar4;
  do {
    prVar4 = local_48[lVar7];
    roaring_iterator_init(prVar4,&local_70);
    _assert_true((ulong)local_70.has_value,"iterator.has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1004);
    uVar2 = local_70.current_value;
    if (local_70.has_value == true) {
      uVar8 = 0;
      do {
        uVar8 = uVar8 + 1;
        roaring_uint32_iterator_advance(&local_70);
      } while (local_70.has_value != false);
      uVar5 = (uint64_t)uVar8;
    }
    else {
      uVar5 = 0;
    }
    uVar6 = roaring_bitmap_get_cardinality(prVar4);
    _assert_true((ulong)(uVar6 == uVar5),"count == roaring_bitmap_get_cardinality(bitmaps[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x100c);
    iVar9 = retry_count;
    if (0 < retry_count) {
      do {
        roaring_uint32_iterator_advance(&local_70);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    roaring_uint32_iterator_previous(&local_70);
    if (local_70.has_value == true) {
      uVar8 = 0;
      do {
        uVar8 = uVar8 + 1;
        roaring_uint32_iterator_previous(&local_70);
      } while (local_70.has_value != false);
      uVar5 = (uint64_t)uVar8;
    }
    else {
      uVar5 = 0;
    }
    uVar6 = roaring_bitmap_get_cardinality(prVar4);
    _assert_true((ulong)(uVar6 == uVar5),"count == roaring_bitmap_get_cardinality(bitmaps[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x101a);
    iVar9 = retry_count;
    if (0 < retry_count) {
      do {
        roaring_uint32_iterator_previous(&local_70);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    roaring_uint32_iterator_advance(&local_70);
    _assert_true((ulong)local_70.has_value,"iterator.has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1022);
    _assert_true((ulong)(uVar2 == local_70.current_value),"first_value == iterator.current_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1023);
    bVar11 = lVar7 == 0;
    lVar7 = lVar7 + 1;
  } while (bVar11);
  roaring_bitmap_free(r);
  roaring_bitmap_free(local_80);
  free(local_88);
  return;
}

Assistant:

void test_iterator_reuse_retry_count(int retry_count) {
    uint32_t *ref_values;
    uint32_t ref_count;
    test_iterator_generate_data(&ref_values, &ref_count);

    roaring_bitmap_t *with_edges = roaring_bitmap_create();
    // We don't want min and max values inside this bitmap
    roaring_bitmap_t *without_edges = roaring_bitmap_create();

    for (uint32_t i = 0; i < ref_count; i++) {
        roaring_bitmap_add(with_edges, ref_values[i]);
        if (i != 0 && i != ref_count - 1) {
            roaring_bitmap_add(without_edges, ref_values[i]);
        }
    }

    // sanity checks
    assert_true(roaring_bitmap_contains(with_edges, 0));
    assert_true(roaring_bitmap_contains(with_edges, UINT32_MAX));
    assert_true(!roaring_bitmap_contains(without_edges, 0));
    assert_true(!roaring_bitmap_contains(without_edges, UINT32_MAX));
    assert_true(roaring_bitmap_get_cardinality(with_edges) - 2 ==
                roaring_bitmap_get_cardinality(without_edges));

    const roaring_bitmap_t *bitmaps[] = {with_edges, without_edges};
    int num_bitmaps = sizeof(bitmaps) / sizeof(bitmaps[0]);

    for (int i = 0; i < num_bitmaps; ++i) {
        roaring_uint32_iterator_t iterator;
        roaring_iterator_init(bitmaps[i], &iterator);
        assert_true(iterator.has_value);
        uint32_t first_value = iterator.current_value;

        uint32_t count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_advance(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test advancing the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_advance(&iterator);
        }

        // Using same iterator we want to go backwards through the list
        roaring_uint32_iterator_previous(&iterator);
        count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_previous(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test decrement the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_previous(&iterator);
        }

        roaring_uint32_iterator_advance(&iterator);
        assert_true(iterator.has_value);
        assert_true(first_value == iterator.current_value);
    }

    roaring_bitmap_free(without_edges);
    roaring_bitmap_free(with_edges);
    free(ref_values);
}